

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O0

void dukglue::types::DukType<std::vector<Dog*,std::allocator<Dog*>>>::
     push<std::vector<Dog*,std::allocator<Dog*>>>
               (duk_context *ctx,vector<Dog_*,_std::allocator<Dog_*>_> *value)

{
  duk_idx_t obj_idx_00;
  size_type sVar1;
  const_reference ppDVar2;
  undefined8 local_28;
  size_t i;
  duk_idx_t obj_idx;
  vector<Dog_*,_std::allocator<Dog_*>_> *value_local;
  duk_context *ctx_local;
  
  obj_idx_00 = duk_push_array(ctx);
  local_28 = 0;
  while( true ) {
    sVar1 = std::vector<Dog_*,_std::allocator<Dog_*>_>::size(value);
    if (sVar1 <= local_28) break;
    ppDVar2 = std::vector<Dog_*,_std::allocator<Dog_*>_>::operator[](value,local_28);
    DukType<Dog>::push<Dog*,void>(ctx,*ppDVar2);
    duk_put_prop_index(ctx,obj_idx_00,(duk_uarridx_t)local_28);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

static void push(duk_context* ctx, const std::vector<T>& value) {
				duk_idx_t obj_idx = duk_push_array(ctx);

				for (size_t i = 0; i < value.size(); i++) {
					DukType< typename Bare<T>::type >::template push<T>(ctx, value[i]);
					duk_put_prop_index(ctx, obj_idx, i);
				}
			}